

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_multi_var
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  size_t sVar2;
  code *pcVar3;
  ulong uVar4;
  secp256k1_fe *rzr;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong local_b8;
  secp256k1_gej tmp;
  
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[4] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n != 0) {
      if (scratch != (secp256k1_scratch *)0x0) {
        sVar2 = secp256k1_scratch_max_allocation(error_callback,scratch,6);
        uVar4 = 1;
        puVar7 = &DAT_00114360;
        uVar9 = 0;
        do {
          if (uVar4 == 0xd) break;
          if (uVar4 < 0xd) {
            uVar6 = *puVar7;
          }
          else {
            uVar6 = 0;
          }
          uVar5 = (ulong)(byte)(0x7f / (byte)((byte)uVar4 + 1));
          uVar8 = (0x80L << ((byte)uVar4 & 0x3f)) + uVar5 * 8 + 0x130;
          if (sVar2 < uVar8) break;
          uVar8 = (sVar2 - uVar8) / (uVar5 * 8 + 0x120);
          uVar5 = uVar8;
          if (uVar6 <= uVar8) {
            uVar5 = uVar6;
          }
          if (uVar9 < uVar5) {
            uVar9 = uVar5;
          }
          puVar7 = puVar7 + 1;
          uVar4 = uVar4 + 1;
        } while (uVar6 <= uVar8);
        if (uVar9 != 0) {
          uVar4 = 5000000;
          if (uVar9 < 5000000) {
            uVar4 = uVar9;
          }
          uVar9 = n - 1;
          local_b8 = uVar9 / uVar4 + 1;
          uVar4 = uVar9 / local_b8;
          if (uVar4 < 0x57) {
            sVar2 = secp256k1_scratch_max_allocation(error_callback,scratch,5);
            if (sVar2 < 0x8b0) goto LAB_00108894;
            uVar4 = 5000000;
            if (sVar2 / 0x8b0 < 5000000) {
              uVar4 = sVar2 / 0x8b0;
            }
            local_b8 = uVar9 / uVar4 + 1;
            uVar4 = uVar9 / local_b8;
            pcVar3 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar3 = secp256k1_ecmult_pippenger_batch;
          }
          uVar4 = uVar4 + 1;
          lVar10 = 0;
          uVar9 = 0;
          while( true ) {
            if (local_b8 == uVar9) {
              return 1;
            }
            uVar6 = uVar4;
            if (n < uVar4) {
              uVar6 = n;
            }
            rzr = (secp256k1_fe *)0x0;
            if (uVar9 == 0) {
              rzr = (secp256k1_fe *)inp_g_sc;
            }
            iVar1 = (*pcVar3)(error_callback,scratch,&tmp,rzr,cb,cbdata,uVar6,lVar10);
            if (iVar1 == 0) break;
            secp256k1_gej_add_var(r,r,&tmp,rzr);
            n = n - uVar6;
            uVar9 = uVar9 + 1;
            lVar10 = lVar10 + uVar4;
          }
          return 0;
        }
      }
LAB_00108894:
      iVar1 = secp256k1_ecmult_multi_simple_var(r,inp_g_sc,cb,cbdata,n);
      return iVar1;
    }
    secp256k1_ecmult(r,r,&secp256k1_scalar_zero,inp_g_sc);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_callback* error_callback, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_ecmult(r, r, &secp256k1_scalar_zero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }

    /* Compute the batch sizes for Pippenger's algorithm given a scratch space. If it's greater than
     * a threshold use Pippenger's algorithm. Otherwise use Strauss' algorithm.
     * As a first step check if there's enough space for Pippenger's algo (which requires less space
     * than Strauss' algo) and if not, use the simple algorithm. */
    if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_pippenger_max_points(error_callback, scratch), n)) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }
    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_strauss_max_points(error_callback, scratch), n)) {
            return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
        }
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(error_callback, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}